

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleARGBCols_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x,int dx)

{
  long lVar1;
  uint32_t *dst;
  
  for (lVar1 = 0; (int)lVar1 < dst_width + -1; lVar1 = lVar1 + 2) {
    *(undefined4 *)(dst_argb + lVar1 * 4) = *(undefined4 *)(src_argb + (long)(x >> 0x10) * 4);
    *(undefined4 *)(dst_argb + lVar1 * 4 + 4) =
         *(undefined4 *)(src_argb + (long)(x + dx >> 0x10) * 4);
    x = x + dx + dx;
  }
  if ((dst_width & 1U) != 0) {
    *(undefined4 *)(dst_argb + lVar1 * 4) = *(undefined4 *)(src_argb + (long)(x >> 0x10) * 4);
  }
  return;
}

Assistant:

void ScaleARGBCols_C(uint8_t* dst_argb,
                     const uint8_t* src_argb,
                     int dst_width,
                     int x,
                     int dx) {
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    dst[0] = src[x >> 16];
    x += dx;
    dst[1] = src[x >> 16];
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[x >> 16];
  }
}